

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void iadst16_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  __m128i alVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  __m128i alVar145;
  undefined1 auVar146 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  __m128i alVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar190 [16];
  __m128i alVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar212 [16];
  __m128i alVar213;
  longlong local_c8;
  longlong lStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  longlong local_48;
  longlong lStack_40;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar25 [16];
  undefined1 auVar33 [16];
  undefined1 auVar38 [16];
  undefined1 auVar26 [16];
  undefined1 auVar34 [16];
  undefined1 auVar39 [16];
  undefined1 auVar27 [16];
  undefined1 auVar35 [16];
  undefined1 auVar40 [16];
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  undefined1 auVar53 [16];
  undefined1 auVar61 [16];
  undefined1 auVar54 [16];
  undefined1 auVar62 [16];
  undefined1 auVar79 [16];
  undefined1 auVar84 [16];
  undefined1 auVar80 [16];
  undefined1 auVar85 [16];
  undefined1 auVar81 [16];
  undefined1 auVar86 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar123 [16];
  undefined1 auVar129 [16];
  undefined1 auVar140 [16];
  undefined1 auVar124 [16];
  undefined1 auVar130 [16];
  undefined1 auVar141 [16];
  undefined1 auVar125 [16];
  undefined1 auVar131 [16];
  undefined1 auVar142 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar157 [16];
  undefined1 auVar167 [16];
  undefined1 auVar158 [16];
  undefined1 auVar168 [16];
  undefined1 auVar159 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  
  alVar1 = input[0xf];
  alVar42 = input[0xd];
  alVar145 = input[0xb];
  alVar182 = input[9];
  auVar159._0_12_ = alVar1._0_12_;
  auVar159._12_2_ = alVar1[0]._6_2_;
  auVar159._14_2_ = *(undefined2 *)((long)*input + 6);
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._0_10_ = alVar1._0_10_;
  auVar158._10_2_ = *(undefined2 *)((long)*input + 4);
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._0_8_ = alVar1[0];
  auVar157._8_2_ = alVar1[0]._4_2_;
  auVar156._8_8_ = auVar157._8_8_;
  auVar156._6_2_ = *(undefined2 *)((long)*input + 2);
  auVar156._4_2_ = alVar1[0]._2_2_;
  auVar156._0_2_ = (undefined2)alVar1[0];
  auVar156._2_2_ = (short)(*input)[0];
  auVar192._2_2_ = (short)(*input)[1];
  auVar192._0_2_ = (short)alVar1[1];
  auVar192._4_2_ = alVar1[1]._2_2_;
  auVar192._6_2_ = *(undefined2 *)((long)*input + 10);
  auVar192._8_2_ = alVar1[1]._4_2_;
  auVar192._10_2_ = *(undefined2 *)((long)*input + 0xc);
  auVar192._12_2_ = alVar1[1]._6_2_;
  auVar192._14_2_ = *(undefined2 *)((long)*input + 0xe);
  auVar43._8_4_ = 0xc90ffb;
  auVar43._0_8_ = 0xc90ffb00c90ffb;
  auVar43._12_4_ = 0xc90ffb;
  auVar96 = pmaddwd(auVar156,auVar43);
  auVar44 = pmaddwd(auVar43,auVar192);
  auVar64._8_4_ = 0xf00500c9;
  auVar64._0_8_ = 0xf00500c9f00500c9;
  auVar64._12_4_ = 0xf00500c9;
  auVar160 = pmaddwd(auVar156,auVar64);
  auVar193 = pmaddwd(auVar192,auVar64);
  auVar97._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar97._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar97._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar97._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar45._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar98 = packssdw(auVar97,auVar45);
  auVar161._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar161._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar161._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar161._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  auVar194._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar194._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar194._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar194._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar162 = packssdw(auVar161,auVar194);
  auVar125._0_12_ = alVar42._0_12_;
  auVar125._12_2_ = alVar42[0]._6_2_;
  auVar125._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar124._12_4_ = auVar125._12_4_;
  auVar124._0_10_ = alVar42._0_10_;
  auVar124._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar123._10_6_ = auVar124._10_6_;
  auVar123._0_8_ = alVar42[0];
  auVar123._8_2_ = alVar42[0]._4_2_;
  auVar122._8_8_ = auVar123._8_8_;
  auVar122._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar122._4_2_ = alVar42[0]._2_2_;
  auVar122._0_2_ = (undefined2)alVar42[0];
  auVar122._2_2_ = (short)input[2][0];
  auVar44._2_2_ = (short)input[2][1];
  auVar44._0_2_ = (short)alVar42[1];
  auVar44._4_2_ = alVar42[1]._2_2_;
  auVar44._6_2_ = *(undefined2 *)((long)input[2] + 10);
  auVar44._8_2_ = alVar42[1]._4_2_;
  auVar44._10_2_ = *(undefined2 *)((long)input[2] + 0xc);
  auVar44._12_2_ = alVar42[1]._6_2_;
  auVar44._14_2_ = *(undefined2 *)((long)input[2] + 0xe);
  auVar65._8_4_ = 0x3e30f85;
  auVar65._0_8_ = 0x3e30f8503e30f85;
  auVar65._12_4_ = 0x3e30f85;
  auVar96 = pmaddwd(auVar122,auVar65);
  auVar160 = pmaddwd(auVar65,auVar44);
  auVar105._8_4_ = 0xf07b03e3;
  auVar105._0_8_ = 0xf07b03e3f07b03e3;
  auVar105._12_4_ = 0xf07b03e3;
  auVar193 = pmaddwd(auVar122,auVar105);
  auVar44 = pmaddwd(auVar44,auVar105);
  auVar46._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar46._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar46._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar46._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar66._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar66._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar66._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar66._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  auVar47 = packssdw(auVar46,auVar66);
  alVar1 = input[7];
  auVar126._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar126._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar126._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar126._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar96._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar96._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar96._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar96._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar127 = packssdw(auVar126,auVar96);
  auVar193._0_12_ = alVar145._0_12_;
  auVar193._12_2_ = alVar145[0]._6_2_;
  auVar193._14_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar13._12_4_ = auVar193._12_4_;
  auVar13._0_10_ = alVar145._0_10_;
  auVar13._10_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar202._10_6_ = auVar13._10_6_;
  auVar202._0_8_ = alVar145[0];
  auVar202._8_2_ = alVar145[0]._4_2_;
  auVar160._8_8_ = auVar202._8_8_;
  auVar160._6_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar160._4_2_ = alVar145[0]._2_2_;
  auVar160._0_2_ = (undefined2)alVar145[0];
  auVar160._2_2_ = (short)input[4][0];
  auVar88._2_2_ = (short)input[4][1];
  auVar88._0_2_ = (short)alVar145[1];
  auVar88._4_2_ = alVar145[1]._2_2_;
  auVar88._6_2_ = *(undefined2 *)((long)input[4] + 10);
  auVar88._8_2_ = alVar145[1]._4_2_;
  auVar88._10_2_ = *(undefined2 *)((long)input[4] + 0xc);
  auVar88._12_2_ = alVar145[1]._6_2_;
  auVar88._14_2_ = *(undefined2 *)((long)input[4] + 0xe);
  auVar20._8_4_ = 0x6d70e77;
  auVar20._0_8_ = 0x6d70e7706d70e77;
  auVar20._12_4_ = 0x6d70e77;
  auVar96 = pmaddwd(auVar160,auVar20);
  auVar193 = pmaddwd(auVar20,auVar88);
  auVar196._8_4_ = 0xf18906d7;
  auVar196._0_8_ = 0xf18906d7f18906d7;
  auVar196._12_4_ = 0xf18906d7;
  auVar44 = pmaddwd(auVar160,auVar196);
  auVar160 = pmaddwd(auVar88,auVar196);
  auVar12._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar21._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar13 = packssdw(auVar12,auVar21);
  alVar42 = input[5];
  auVar183._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar183._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar183._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar183._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar89._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar89._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar89._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar89._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  auVar44 = packssdw(auVar183,auVar89);
  auVar131._0_12_ = alVar182._0_12_;
  auVar131._12_2_ = alVar182[0]._6_2_;
  auVar131._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._0_10_ = alVar182._0_10_;
  auVar130._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._0_8_ = alVar182[0];
  auVar129._8_2_ = alVar182[0]._4_2_;
  auVar128._8_8_ = auVar129._8_8_;
  auVar128._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar128._4_2_ = alVar182[0]._2_2_;
  auVar128._0_2_ = (undefined2)alVar182[0];
  auVar128._2_2_ = (short)input[6][0];
  auVar201._2_2_ = (short)input[6][1];
  auVar201._0_2_ = (short)alVar182[1];
  auVar201._4_2_ = alVar182[1]._2_2_;
  auVar201._6_2_ = *(undefined2 *)((long)input[6] + 10);
  auVar201._8_2_ = alVar182[1]._4_2_;
  auVar201._10_2_ = *(undefined2 *)((long)input[6] + 0xc);
  auVar201._12_2_ = alVar182[1]._6_2_;
  auVar201._14_2_ = *(undefined2 *)((long)input[6] + 0xe);
  auVar106._8_4_ = 0x9880cda;
  auVar106._0_8_ = 0x9880cda09880cda;
  auVar106._12_4_ = 0x9880cda;
  auVar96 = pmaddwd(auVar128,auVar106);
  auVar160 = pmaddwd(auVar106,auVar201);
  auVar91._8_4_ = 0xf3260988;
  auVar91._0_8_ = 0xf3260988f3260988;
  auVar91._12_4_ = 0xf3260988;
  auVar193 = pmaddwd(auVar128,auVar91);
  auVar202 = pmaddwd(auVar201,auVar91);
  auVar90._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar90._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar90._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar90._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar107._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar107._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar107._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar107._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  auVar91 = packssdw(auVar90,auVar107);
  auVar132._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar132._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar132._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar132._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar203._0_4_ = auVar202._0_4_ + 0x800 >> 0xc;
  auVar203._4_4_ = auVar202._4_4_ + 0x800 >> 0xc;
  auVar203._8_4_ = auVar202._8_4_ + 0x800 >> 0xc;
  auVar203._12_4_ = auVar202._12_4_ + 0x800 >> 0xc;
  auVar133 = packssdw(auVar132,auVar203);
  auVar149._0_12_ = alVar1._0_12_;
  auVar149._12_2_ = alVar1[0]._6_2_;
  auVar149._14_2_ = *(undefined2 *)((long)input[8] + 6);
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._0_10_ = alVar1._0_10_;
  auVar148._10_2_ = *(undefined2 *)((long)input[8] + 4);
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._0_8_ = alVar1[0];
  auVar147._8_2_ = alVar1[0]._4_2_;
  auVar146._8_8_ = auVar147._8_8_;
  auVar146._6_2_ = *(undefined2 *)((long)input[8] + 2);
  auVar146._4_2_ = alVar1[0]._2_2_;
  auVar146._0_2_ = (undefined2)alVar1[0];
  auVar146._2_2_ = (short)input[8][0];
  auVar67._2_2_ = (short)input[8][1];
  auVar67._0_2_ = (short)alVar1[1];
  auVar67._4_2_ = alVar1[1]._2_2_;
  auVar67._6_2_ = *(undefined2 *)((long)input[8] + 10);
  auVar67._8_2_ = alVar1[1]._4_2_;
  auVar67._10_2_ = *(undefined2 *)((long)input[8] + 0xc);
  auVar67._12_2_ = alVar1[1]._6_2_;
  auVar67._14_2_ = *(undefined2 *)((long)input[8] + 0xe);
  auVar108._8_4_ = 0xbdb0abf;
  auVar108._0_8_ = 0xbdb0abf0bdb0abf;
  auVar108._12_4_ = 0xbdb0abf;
  auVar96 = pmaddwd(auVar146,auVar108);
  auVar160 = pmaddwd(auVar108,auVar67);
  auVar134._8_4_ = 0xf5410bdb;
  auVar134._0_8_ = 0xf5410bdbf5410bdb;
  auVar134._12_4_ = 0xf5410bdb;
  auVar202 = pmaddwd(auVar146,auVar134);
  auVar193 = pmaddwd(auVar67,auVar134);
  auVar205._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar205._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar205._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar205._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar109._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar109._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar109._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar109._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  auVar160 = packssdw(auVar205,auVar109);
  auVar150._0_4_ = auVar202._0_4_ + 0x800 >> 0xc;
  auVar150._4_4_ = auVar202._4_4_ + 0x800 >> 0xc;
  auVar150._8_4_ = auVar202._8_4_ + 0x800 >> 0xc;
  auVar150._12_4_ = auVar202._12_4_ + 0x800 >> 0xc;
  auVar68._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar68._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar68._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar68._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar151 = packssdw(auVar150,auVar68);
  auVar175._0_12_ = alVar42._0_12_;
  auVar175._12_2_ = alVar42[0]._6_2_;
  auVar175._14_2_ = *(undefined2 *)((long)input[10] + 6);
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._0_10_ = alVar42._0_10_;
  auVar174._10_2_ = *(undefined2 *)((long)input[10] + 4);
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._0_8_ = alVar42[0];
  auVar173._8_2_ = alVar42[0]._4_2_;
  auVar172._8_8_ = auVar173._8_8_;
  auVar172._6_2_ = *(undefined2 *)((long)input[10] + 2);
  auVar172._4_2_ = alVar42[0]._2_2_;
  auVar172._0_2_ = (undefined2)alVar42[0];
  auVar172._2_2_ = (short)input[10][0];
  auVar22._2_2_ = (short)input[10][1];
  auVar22._0_2_ = (short)alVar42[1];
  auVar22._4_2_ = alVar42[1]._2_2_;
  auVar22._6_2_ = *(undefined2 *)((long)input[10] + 10);
  auVar22._8_2_ = alVar42[1]._4_2_;
  auVar22._10_2_ = *(undefined2 *)((long)input[10] + 0xc);
  auVar22._12_2_ = alVar42[1]._6_2_;
  auVar22._14_2_ = *(undefined2 *)((long)input[10] + 0xe);
  auVar69._8_4_ = 0xdb9083a;
  auVar69._0_8_ = 0xdb9083a0db9083a;
  auVar69._12_4_ = 0xdb9083a;
  auVar183 = pmaddwd(auVar172,auVar69);
  auVar193 = pmaddwd(auVar69,auVar22);
  auVar136._8_4_ = 0xf7c60db9;
  auVar136._0_8_ = 0xf7c60db9f7c60db9;
  auVar136._12_4_ = 0xf7c60db9;
  auVar202 = pmaddwd(auVar172,auVar136);
  auVar96 = pmaddwd(auVar22,auVar136);
  alVar1 = input[3];
  auVar184._0_4_ = auVar183._0_4_ + 0x800 >> 0xc;
  auVar184._4_4_ = auVar183._4_4_ + 0x800 >> 0xc;
  auVar184._8_4_ = auVar183._8_4_ + 0x800 >> 0xc;
  auVar184._12_4_ = auVar183._12_4_ + 0x800 >> 0xc;
  auVar70._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar70._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar70._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar70._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar185 = packssdw(auVar184,auVar70);
  auVar176._0_4_ = auVar202._0_4_ + 0x800 >> 0xc;
  auVar176._4_4_ = auVar202._4_4_ + 0x800 >> 0xc;
  auVar176._8_4_ = auVar202._8_4_ + 0x800 >> 0xc;
  auVar176._12_4_ = auVar202._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar177 = packssdw(auVar176,auVar23);
  auVar27._0_12_ = alVar1._0_12_;
  auVar27._12_2_ = alVar1[0]._6_2_;
  auVar27._14_2_ = *(undefined2 *)((long)input[0xc] + 6);
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_10_ = alVar1._0_10_;
  auVar26._10_2_ = *(undefined2 *)((long)input[0xc] + 4);
  auVar25._10_6_ = auVar26._10_6_;
  auVar25._0_8_ = alVar1[0];
  auVar25._8_2_ = alVar1[0]._4_2_;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._6_2_ = *(undefined2 *)((long)input[0xc] + 2);
  auVar24._4_2_ = alVar1[0]._2_2_;
  auVar24._0_2_ = (undefined2)alVar1[0];
  auVar24._2_2_ = (short)input[0xc][0];
  auVar112._2_2_ = (short)input[0xc][1];
  auVar112._0_2_ = (short)alVar1[1];
  auVar112._4_2_ = alVar1[1]._2_2_;
  auVar112._6_2_ = *(undefined2 *)((long)input[0xc] + 10);
  auVar112._8_2_ = alVar1[1]._4_2_;
  auVar112._10_2_ = *(undefined2 *)((long)input[0xc] + 0xc);
  auVar112._12_2_ = alVar1[1]._6_2_;
  auVar112._14_2_ = *(undefined2 *)((long)input[0xc] + 0xe);
  auVar71._8_4_ = 0xf110564;
  auVar71._0_8_ = 0xf1105640f110564;
  auVar71._12_4_ = 0xf110564;
  auVar183 = pmaddwd(auVar24,auVar71);
  auVar202 = pmaddwd(auVar71,auVar112);
  auVar110._8_4_ = 0xfa9c0f11;
  auVar110._0_8_ = 0xfa9c0f11fa9c0f11;
  auVar110._12_4_ = 0xfa9c0f11;
  auVar193 = pmaddwd(auVar24,auVar110);
  auVar96 = pmaddwd(auVar112,auVar110);
  auVar204._0_4_ = auVar183._0_4_ + 0x800 >> 0xc;
  auVar204._4_4_ = auVar183._4_4_ + 0x800 >> 0xc;
  auVar204._8_4_ = auVar183._8_4_ + 0x800 >> 0xc;
  auVar204._12_4_ = auVar183._12_4_ + 0x800 >> 0xc;
  auVar72._0_4_ = auVar202._0_4_ + 0x800 >> 0xc;
  auVar72._4_4_ = auVar202._4_4_ + 0x800 >> 0xc;
  auVar72._8_4_ = auVar202._8_4_ + 0x800 >> 0xc;
  auVar72._12_4_ = auVar202._12_4_ + 0x800 >> 0xc;
  auVar205 = packssdw(auVar204,auVar72);
  auVar28._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar48._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar183 = packssdw(auVar28,auVar48);
  alVar1 = input[1];
  auVar163._0_12_ = alVar1._0_12_;
  auVar163._12_2_ = alVar1[0]._6_2_;
  auVar163._14_2_ = *(undefined2 *)((long)input[0xe] + 6);
  auVar99._12_4_ = auVar163._12_4_;
  auVar99._0_10_ = alVar1._0_10_;
  auVar99._10_2_ = *(undefined2 *)((long)input[0xe] + 4);
  auVar92._10_6_ = auVar99._10_6_;
  auVar92._0_8_ = alVar1[0];
  auVar92._8_2_ = alVar1[0]._4_2_;
  auVar75._8_8_ = auVar92._8_8_;
  auVar75._6_2_ = *(undefined2 *)((long)input[0xe] + 2);
  auVar75._4_2_ = alVar1[0]._2_2_;
  auVar75._0_2_ = (undefined2)alVar1[0];
  auVar75._2_2_ = (short)input[0xe][0];
  auVar73._2_2_ = (short)input[0xe][1];
  auVar73._0_2_ = (short)alVar1[1];
  auVar73._4_2_ = alVar1[1]._2_2_;
  auVar73._6_2_ = *(undefined2 *)((long)input[0xe] + 10);
  auVar73._8_2_ = alVar1[1]._4_2_;
  auVar73._10_2_ = *(undefined2 *)((long)input[0xe] + 0xc);
  auVar73._12_2_ = alVar1[1]._6_2_;
  auVar73._14_2_ = *(undefined2 *)((long)input[0xe] + 0xe);
  auVar135._8_4_ = 0xfd40259;
  auVar135._0_8_ = 0xfd402590fd40259;
  auVar135._12_4_ = 0xfd40259;
  auVar202 = pmaddwd(auVar75,auVar135);
  auVar136 = pmaddwd(auVar135,auVar73);
  auVar195._8_4_ = 0xfda70fd4;
  auVar195._0_8_ = 0xfda70fd4fda70fd4;
  auVar195._12_4_ = 0xfda70fd4;
  auVar96 = pmaddwd(auVar75,auVar195);
  auVar193 = pmaddwd(auVar73,auVar195);
  auVar111._0_4_ = auVar202._0_4_ + 0x800 >> 0xc;
  auVar111._4_4_ = auVar202._4_4_ + 0x800 >> 0xc;
  auVar111._8_4_ = auVar202._8_4_ + 0x800 >> 0xc;
  auVar111._12_4_ = auVar202._12_4_ + 0x800 >> 0xc;
  auVar137._0_4_ = auVar136._0_4_ + 0x800 >> 0xc;
  auVar137._4_4_ = auVar136._4_4_ + 0x800 >> 0xc;
  auVar137._8_4_ = auVar136._8_4_ + 0x800 >> 0xc;
  auVar137._12_4_ = auVar136._12_4_ + 0x800 >> 0xc;
  auVar112 = packssdw(auVar111,auVar137);
  auVar118._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar118._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar118._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar118._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar74._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar74._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar74._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar74._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar96 = packssdw(auVar118,auVar74);
  auVar75 = paddsw(auVar98,auVar160);
  auVar99 = psubsw(auVar98,auVar160);
  auVar160 = paddsw(auVar162,auVar151);
  auVar163 = psubsw(auVar162,auVar151);
  auVar196 = paddsw(auVar47,auVar185);
  auVar48 = psubsw(auVar47,auVar185);
  auVar151 = paddsw(auVar127,auVar177);
  auVar193 = psubsw(auVar127,auVar177);
  auVar202 = paddsw(auVar13,auVar205);
  auVar136 = psubsw(auVar13,auVar205);
  auVar13 = paddsw(auVar44,auVar183);
  auVar162 = psubsw(auVar44,auVar183);
  auVar183 = paddsw(auVar91,auVar112);
  auVar92 = psubsw(auVar91,auVar112);
  auVar91 = paddsw(auVar133,auVar96);
  auVar112 = psubsw(auVar133,auVar96);
  auVar116._0_12_ = auVar99._0_12_;
  auVar116._12_2_ = auVar99._6_2_;
  auVar116._14_2_ = auVar163._6_2_;
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._0_10_ = auVar99._0_10_;
  auVar115._10_2_ = auVar163._4_2_;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._0_8_ = auVar99._0_8_;
  auVar114._8_2_ = auVar99._4_2_;
  auVar113._8_8_ = auVar114._8_8_;
  auVar113._6_2_ = auVar163._2_2_;
  auVar113._4_2_ = auVar99._2_2_;
  auVar113._0_2_ = auVar99._0_2_;
  auVar113._2_2_ = auVar163._0_2_;
  auVar100._2_2_ = auVar163._8_2_;
  auVar100._0_2_ = auVar99._8_2_;
  auVar100._4_2_ = auVar99._10_2_;
  auVar100._6_2_ = auVar163._10_2_;
  auVar100._8_2_ = auVar99._12_2_;
  auVar100._10_2_ = auVar163._12_2_;
  auVar100._12_2_ = auVar99._14_2_;
  auVar100._14_2_ = auVar163._14_2_;
  auVar47._8_4_ = 0xf04f031f;
  auVar47._0_8_ = 0xf04f031ff04f031f;
  auVar47._12_4_ = 0xf04f031f;
  auVar99 = pmaddwd(auVar113,auVar47);
  auVar96 = pmaddwd(auVar100,auVar47);
  auVar164._8_4_ = 0x31f0fb1;
  auVar164._0_8_ = 0x31f0fb1031f0fb1;
  auVar164._12_4_ = 0x31f0fb1;
  auVar163 = pmaddwd(auVar113,auVar164);
  auVar44 = pmaddwd(auVar100,auVar164);
  auVar152._0_4_ = auVar163._0_4_ + 0x800 >> 0xc;
  auVar152._4_4_ = auVar163._4_4_ + 0x800 >> 0xc;
  auVar152._8_4_ = auVar163._8_4_ + 0x800 >> 0xc;
  auVar152._12_4_ = auVar163._12_4_ + 0x800 >> 0xc;
  auVar2._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar2._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar2._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar2._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar133 = packssdw(auVar152,auVar2);
  auVar117._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar117._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar117._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar117._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar101._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar101._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar101._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar101._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar117,auVar101);
  auVar189._0_12_ = auVar48._0_12_;
  auVar189._12_2_ = auVar48._6_2_;
  auVar189._14_2_ = auVar193._6_2_;
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._0_10_ = auVar48._0_10_;
  auVar188._10_2_ = auVar193._4_2_;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._0_8_ = auVar48._0_8_;
  auVar187._8_2_ = auVar48._4_2_;
  auVar186._8_8_ = auVar187._8_8_;
  auVar186._6_2_ = auVar193._2_2_;
  auVar186._4_2_ = auVar48._2_2_;
  auVar186._0_2_ = auVar48._0_2_;
  auVar186._2_2_ = auVar193._0_2_;
  auVar49._2_2_ = auVar193._8_2_;
  auVar49._0_2_ = auVar48._8_2_;
  auVar49._4_2_ = auVar48._10_2_;
  auVar49._6_2_ = auVar193._10_2_;
  auVar49._8_2_ = auVar48._12_2_;
  auVar49._10_2_ = auVar193._12_2_;
  auVar49._12_2_ = auVar48._14_2_;
  auVar49._14_2_ = auVar193._14_2_;
  auVar98._8_4_ = 0xf71c0d4e;
  auVar98._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar98._12_4_ = 0xf71c0d4e;
  auVar48 = pmaddwd(auVar186,auVar98);
  auVar96 = pmaddwd(auVar49,auVar98);
  auVar127._8_4_ = 0xd4e08e4;
  auVar127._0_8_ = 0xd4e08e40d4e08e4;
  auVar127._12_4_ = 0xd4e08e4;
  auVar193 = pmaddwd(auVar186,auVar127);
  auVar44 = pmaddwd(auVar49,auVar127);
  auVar102._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar102._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar102._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar102._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar3._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar3._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar3._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar3._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar163 = packssdw(auVar102,auVar3);
  auVar190._0_4_ = auVar48._0_4_ + 0x800 >> 0xc;
  auVar190._4_4_ = auVar48._4_4_ + 0x800 >> 0xc;
  auVar190._8_4_ = auVar48._8_4_ + 0x800 >> 0xc;
  auVar190._12_4_ = auVar48._12_4_ + 0x800 >> 0xc;
  auVar50._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar98 = packssdw(auVar190,auVar50);
  auVar54._0_12_ = auVar136._0_12_;
  auVar54._12_2_ = auVar136._6_2_;
  auVar54._14_2_ = auVar162._6_2_;
  auVar53._12_4_ = auVar54._12_4_;
  auVar53._0_10_ = auVar136._0_10_;
  auVar53._10_2_ = auVar162._4_2_;
  auVar52._10_6_ = auVar53._10_6_;
  auVar52._0_8_ = auVar136._0_8_;
  auVar52._8_2_ = auVar136._4_2_;
  auVar51._8_8_ = auVar52._8_8_;
  auVar51._6_2_ = auVar162._2_2_;
  auVar51._4_2_ = auVar136._2_2_;
  auVar51._0_2_ = auVar136._0_2_;
  auVar51._2_2_ = auVar162._0_2_;
  auVar14._2_2_ = auVar162._8_2_;
  auVar14._0_2_ = auVar136._8_2_;
  auVar14._4_2_ = auVar136._10_2_;
  auVar14._6_2_ = auVar162._10_2_;
  auVar14._8_2_ = auVar136._12_2_;
  auVar14._10_2_ = auVar162._12_2_;
  auVar14._12_2_ = auVar136._14_2_;
  auVar14._14_2_ = auVar162._14_2_;
  auVar4._8_4_ = 0xfb1fce1;
  auVar4._0_8_ = 0xfb1fce10fb1fce1;
  auVar4._12_4_ = 0xfb1fce1;
  auVar136 = pmaddwd(auVar51,auVar4);
  auVar44 = pmaddwd(auVar4,auVar14);
  auVar193 = pmaddwd(auVar51,auVar164);
  auVar96 = pmaddwd(auVar14,auVar164);
  auVar138._0_4_ = auVar136._0_4_ + 0x800 >> 0xc;
  auVar138._4_4_ = auVar136._4_4_ + 0x800 >> 0xc;
  auVar138._8_4_ = auVar136._8_4_ + 0x800 >> 0xc;
  auVar138._12_4_ = auVar136._12_4_ + 0x800 >> 0xc;
  auVar5._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar5._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar5._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar5._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar47 = packssdw(auVar138,auVar5);
  auVar55._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar15._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar48 = packssdw(auVar55,auVar15);
  auVar9._0_12_ = auVar92._0_12_;
  auVar9._12_2_ = auVar92._6_2_;
  auVar9._14_2_ = auVar112._6_2_;
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._0_10_ = auVar92._0_10_;
  auVar8._10_2_ = auVar112._4_2_;
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._0_8_ = auVar92._0_8_;
  auVar7._8_2_ = auVar92._4_2_;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._6_2_ = auVar112._2_2_;
  auVar6._4_2_ = auVar92._2_2_;
  auVar6._0_2_ = auVar92._0_2_;
  auVar6._2_2_ = auVar112._0_2_;
  auVar93._2_2_ = auVar112._8_2_;
  auVar93._0_2_ = auVar92._8_2_;
  auVar93._4_2_ = auVar92._10_2_;
  auVar93._6_2_ = auVar112._10_2_;
  auVar93._8_2_ = auVar92._12_2_;
  auVar93._10_2_ = auVar112._12_2_;
  auVar93._12_2_ = auVar92._14_2_;
  auVar93._14_2_ = auVar112._14_2_;
  auVar29._8_4_ = 0x8e4f2b2;
  auVar29._0_8_ = 0x8e4f2b208e4f2b2;
  auVar29._12_4_ = 0x8e4f2b2;
  auVar96 = pmaddwd(auVar6,auVar29);
  auVar193 = pmaddwd(auVar29,auVar93);
  auVar44 = pmaddwd(auVar6,auVar127);
  auVar136 = pmaddwd(auVar93,auVar127);
  auVar16._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar30._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar193 = packssdw(auVar16,auVar30);
  auVar10._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar94._0_4_ = auVar136._0_4_ + 0x800 >> 0xc;
  auVar94._4_4_ = auVar136._4_4_ + 0x800 >> 0xc;
  auVar94._8_4_ = auVar136._8_4_ + 0x800 >> 0xc;
  auVar94._12_4_ = auVar136._12_4_ + 0x800 >> 0xc;
  auVar96 = packssdw(auVar10,auVar94);
  auVar127 = paddsw(auVar75,auVar202);
  auVar202 = psubsw(auVar75,auVar202);
  auVar92 = paddsw(auVar160,auVar13);
  auVar44 = psubsw(auVar160,auVar13);
  auVar13 = paddsw(auVar196,auVar183);
  auVar162 = psubsw(auVar196,auVar183);
  auVar99 = paddsw(auVar151,auVar91);
  auVar75 = psubsw(auVar151,auVar91);
  auVar177 = paddsw(auVar133,auVar47);
  auVar47 = psubsw(auVar133,auVar47);
  auVar136 = paddsw(auVar118,auVar48);
  auVar112 = psubsw(auVar118,auVar48);
  auVar91 = paddsw(auVar163,auVar193);
  auVar193 = psubsw(auVar163,auVar193);
  auVar160 = paddsw(auVar98,auVar96);
  auVar48 = psubsw(auVar98,auVar96);
  auVar142._0_12_ = auVar202._0_12_;
  auVar142._12_2_ = auVar202._6_2_;
  auVar142._14_2_ = auVar44._6_2_;
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._0_10_ = auVar202._0_10_;
  auVar141._10_2_ = auVar44._4_2_;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._0_8_ = auVar202._0_8_;
  auVar140._8_2_ = auVar202._4_2_;
  auVar139._8_8_ = auVar140._8_8_;
  auVar139._6_2_ = auVar44._2_2_;
  auVar139._4_2_ = auVar202._2_2_;
  auVar139._0_2_ = auVar202._0_2_;
  auVar139._2_2_ = auVar44._0_2_;
  auVar76._2_2_ = auVar44._8_2_;
  auVar76._0_2_ = auVar202._8_2_;
  auVar76._4_2_ = auVar202._10_2_;
  auVar76._6_2_ = auVar44._10_2_;
  auVar76._8_2_ = auVar202._12_2_;
  auVar76._10_2_ = auVar44._12_2_;
  auVar76._12_2_ = auVar202._14_2_;
  auVar76._14_2_ = auVar44._14_2_;
  auVar17._8_4_ = 0x61f0ec8;
  auVar17._0_8_ = 0x61f0ec8061f0ec8;
  auVar17._12_4_ = 0x61f0ec8;
  auVar96 = pmaddwd(auVar139,auVar17);
  auVar44 = pmaddwd(auVar76,auVar17);
  auVar56._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar133._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar133._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar133._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar133._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar183 = packssdw(auVar56,auVar133);
  auVar31._8_4_ = 0xf138061f;
  auVar31._0_8_ = 0xf138061ff138061f;
  auVar31._12_4_ = 0xf138061f;
  auVar96 = pmaddwd(auVar139,auVar31);
  auVar44 = pmaddwd(auVar76,auVar31);
  auVar143._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar143._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar143._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar143._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar77._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar77._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar77._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar77._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar143,auVar77);
  auVar81._0_12_ = auVar162._0_12_;
  auVar81._12_2_ = auVar162._6_2_;
  auVar81._14_2_ = auVar75._6_2_;
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._0_10_ = auVar162._0_10_;
  auVar80._10_2_ = auVar75._4_2_;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._0_8_ = auVar162._0_8_;
  auVar79._8_2_ = auVar162._4_2_;
  auVar78._8_8_ = auVar79._8_8_;
  auVar78._6_2_ = auVar75._2_2_;
  auVar78._4_2_ = auVar162._2_2_;
  auVar78._0_2_ = auVar162._0_2_;
  auVar78._2_2_ = auVar75._0_2_;
  auVar197._2_2_ = auVar75._8_2_;
  auVar197._0_2_ = auVar162._8_2_;
  auVar197._4_2_ = auVar162._10_2_;
  auVar197._6_2_ = auVar75._10_2_;
  auVar197._8_2_ = auVar162._12_2_;
  auVar197._10_2_ = auVar75._12_2_;
  auVar197._12_2_ = auVar162._14_2_;
  auVar197._14_2_ = auVar75._14_2_;
  auVar151._8_4_ = 0xec8f9e1;
  auVar151._0_8_ = 0xec8f9e10ec8f9e1;
  auVar151._12_4_ = 0xec8f9e1;
  auVar44 = pmaddwd(auVar78,auVar151);
  auVar96 = pmaddwd(auVar197,auVar151);
  auVar11._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar165._0_4_ = auVar96._0_4_ + 0x800 >> 0xc;
  auVar165._4_4_ = auVar96._4_4_ + 0x800 >> 0xc;
  auVar165._8_4_ = auVar96._8_4_ + 0x800 >> 0xc;
  auVar165._12_4_ = auVar96._12_4_ + 0x800 >> 0xc;
  auVar96 = packssdw(auVar11,auVar165);
  auVar44 = pmaddwd(auVar78,auVar17);
  auVar202 = pmaddwd(auVar197,auVar17);
  auVar82._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar82._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar82._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar82._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar198._0_4_ = auVar202._0_4_ + 0x800 >> 0xc;
  auVar198._4_4_ = auVar202._4_4_ + 0x800 >> 0xc;
  auVar198._8_4_ = auVar202._8_4_ + 0x800 >> 0xc;
  auVar198._12_4_ = auVar202._12_4_ + 0x800 >> 0xc;
  auVar75 = packssdw(auVar82,auVar198);
  auVar169._0_12_ = auVar47._0_12_;
  auVar169._12_2_ = auVar47._6_2_;
  auVar169._14_2_ = auVar112._6_2_;
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._0_10_ = auVar47._0_10_;
  auVar168._10_2_ = auVar112._4_2_;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._0_8_ = auVar47._0_8_;
  auVar167._8_2_ = auVar47._4_2_;
  auVar166._8_8_ = auVar167._8_8_;
  auVar166._6_2_ = auVar112._2_2_;
  auVar166._4_2_ = auVar47._2_2_;
  auVar166._0_2_ = auVar47._0_2_;
  auVar166._2_2_ = auVar112._0_2_;
  auVar153._2_2_ = auVar112._8_2_;
  auVar153._0_2_ = auVar47._8_2_;
  auVar153._4_2_ = auVar47._10_2_;
  auVar153._6_2_ = auVar112._10_2_;
  auVar153._8_2_ = auVar47._12_2_;
  auVar153._10_2_ = auVar112._12_2_;
  auVar153._12_2_ = auVar47._14_2_;
  auVar153._14_2_ = auVar112._14_2_;
  auVar112 = pmaddwd(auVar166,auVar31);
  auVar202 = pmaddwd(auVar153,auVar31);
  auVar44 = pmaddwd(auVar166,auVar17);
  auVar163 = pmaddwd(auVar153,auVar17);
  auVar119._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar119._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar119._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar119._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar199._0_4_ = auVar163._0_4_ + 0x800 >> 0xc;
  auVar199._4_4_ = auVar163._4_4_ + 0x800 >> 0xc;
  auVar199._8_4_ = auVar163._8_4_ + 0x800 >> 0xc;
  auVar199._12_4_ = auVar163._12_4_ + 0x800 >> 0xc;
  auVar163 = packssdw(auVar119,auVar199);
  auVar170._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar170._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar170._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar170._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar154._0_4_ = auVar202._0_4_ + 0x800 >> 0xc;
  auVar154._4_4_ = auVar202._4_4_ + 0x800 >> 0xc;
  auVar154._8_4_ = auVar202._8_4_ + 0x800 >> 0xc;
  auVar154._12_4_ = auVar202._12_4_ + 0x800 >> 0xc;
  auVar98 = packssdw(auVar170,auVar154);
  auVar35._0_12_ = auVar193._0_12_;
  auVar35._12_2_ = auVar193._6_2_;
  auVar35._14_2_ = auVar48._6_2_;
  auVar34._12_4_ = auVar35._12_4_;
  auVar34._0_10_ = auVar193._0_10_;
  auVar34._10_2_ = auVar48._4_2_;
  auVar33._10_6_ = auVar34._10_6_;
  auVar33._0_8_ = auVar193._0_8_;
  auVar33._8_2_ = auVar193._4_2_;
  auVar32._8_8_ = auVar33._8_8_;
  auVar32._6_2_ = auVar48._2_2_;
  auVar32._4_2_ = auVar193._2_2_;
  auVar32._0_2_ = auVar193._0_2_;
  auVar32._2_2_ = auVar48._0_2_;
  auVar103._2_2_ = auVar48._8_2_;
  auVar103._0_2_ = auVar193._8_2_;
  auVar103._4_2_ = auVar193._10_2_;
  auVar103._6_2_ = auVar48._10_2_;
  auVar103._8_2_ = auVar193._12_2_;
  auVar103._10_2_ = auVar48._12_2_;
  auVar103._12_2_ = auVar193._14_2_;
  auVar103._14_2_ = auVar48._14_2_;
  auVar112 = pmaddwd(auVar32,auVar151);
  auVar44 = pmaddwd(auVar151,auVar103);
  auVar193 = pmaddwd(auVar32,auVar17);
  auVar202 = pmaddwd(auVar103,auVar17);
  auVar155._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar155._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar155._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar155._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar162._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar162._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar162._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar162._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar47 = packssdw(auVar155,auVar162);
  auVar36._0_4_ = auVar193._0_4_ + 0x800 >> 0xc;
  auVar36._4_4_ = auVar193._4_4_ + 0x800 >> 0xc;
  auVar36._8_4_ = auVar193._8_4_ + 0x800 >> 0xc;
  auVar36._12_4_ = auVar193._12_4_ + 0x800 >> 0xc;
  auVar104._0_4_ = auVar202._0_4_ + 0x800 >> 0xc;
  auVar104._4_4_ = auVar202._4_4_ + 0x800 >> 0xc;
  auVar104._8_4_ = auVar202._8_4_ + 0x800 >> 0xc;
  auVar104._12_4_ = auVar202._12_4_ + 0x800 >> 0xc;
  auVar112 = packssdw(auVar36,auVar104);
  auVar193 = paddsw(auVar127,auVar13);
  auVar127 = psubsw(auVar127,auVar13);
  auVar202 = paddsw(auVar92,auVar99);
  auVar44 = psubsw(auVar92,auVar99);
  auVar13 = paddsw(auVar183,auVar96);
  auVar48 = psubsw(auVar183,auVar96);
  auVar96 = paddsw(auVar118,auVar75);
  auVar99 = psubsw(auVar118,auVar75);
  auVar183 = paddsw(auVar177,auVar91);
  auVar133 = psubsw(auVar177,auVar91);
  auVar91 = paddsw(auVar136,auVar160);
  auVar75 = psubsw(auVar136,auVar160);
  alVar191 = (__m128i)paddsw(auVar163,auVar47);
  auVar92 = psubsw(auVar163,auVar47);
  auVar163 = paddsw(auVar98,auVar112);
  auVar118 = psubsw(auVar98,auVar112);
  auVar40._0_12_ = auVar127._0_12_;
  auVar40._12_2_ = auVar127._6_2_;
  auVar40._14_2_ = auVar44._6_2_;
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = auVar127._0_10_;
  auVar39._10_2_ = auVar44._4_2_;
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = auVar127._0_8_;
  auVar38._8_2_ = auVar127._4_2_;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._6_2_ = auVar44._2_2_;
  auVar37._4_2_ = auVar127._2_2_;
  auVar37._0_2_ = auVar127._0_2_;
  auVar37._2_2_ = auVar44._0_2_;
  auVar178._2_2_ = auVar44._8_2_;
  auVar178._0_2_ = auVar127._8_2_;
  auVar178._4_2_ = auVar127._10_2_;
  auVar178._6_2_ = auVar44._10_2_;
  auVar178._8_2_ = auVar127._12_2_;
  auVar178._10_2_ = auVar44._12_2_;
  auVar178._12_2_ = auVar127._14_2_;
  auVar178._14_2_ = auVar44._14_2_;
  auVar177._8_4_ = 0xb500b50;
  auVar177._0_8_ = 0xb500b500b500b50;
  auVar177._12_4_ = 0xb500b50;
  auVar160 = pmaddwd(auVar37,auVar177);
  auVar44 = pmaddwd(auVar178,auVar177);
  auVar95._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar95._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar95._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar95._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  auVar18._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar112 = packssdw(auVar95,auVar18);
  auVar19._8_4_ = 0xf4b00b50;
  auVar19._0_8_ = 0xf4b00b50f4b00b50;
  auVar19._12_4_ = 0xf4b00b50;
  auVar44 = pmaddwd(auVar37,auVar19);
  auVar160 = pmaddwd(auVar178,auVar19);
  auVar41._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar179._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar179._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar179._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar179._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  alVar42 = (__m128i)packssdw(auVar41,auVar179);
  auVar86._0_12_ = auVar48._0_12_;
  auVar86._12_2_ = auVar48._6_2_;
  auVar86._14_2_ = auVar99._6_2_;
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._0_10_ = auVar48._0_10_;
  auVar85._10_2_ = auVar99._4_2_;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._0_8_ = auVar48._0_8_;
  auVar84._8_2_ = auVar48._4_2_;
  auVar83._8_8_ = auVar84._8_8_;
  auVar83._6_2_ = auVar99._2_2_;
  auVar83._4_2_ = auVar48._2_2_;
  auVar83._0_2_ = auVar48._0_2_;
  auVar83._2_2_ = auVar99._0_2_;
  auVar57._2_2_ = auVar99._8_2_;
  auVar57._0_2_ = auVar48._8_2_;
  auVar57._4_2_ = auVar48._10_2_;
  auVar57._6_2_ = auVar99._10_2_;
  auVar57._8_2_ = auVar48._12_2_;
  auVar57._10_2_ = auVar99._12_2_;
  auVar57._12_2_ = auVar48._14_2_;
  auVar57._14_2_ = auVar99._14_2_;
  auVar44 = pmaddwd(auVar83,auVar177);
  auVar160 = pmaddwd(auVar57,auVar177);
  auVar144._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar144._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar144._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar144._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar180._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar180._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar180._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar180._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  alVar145 = (__m128i)packssdw(auVar144,auVar180);
  auVar160 = pmaddwd(auVar83,auVar19);
  auVar44 = pmaddwd(auVar57,auVar19);
  auVar87._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar87._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar87._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar87._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  auVar58._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar58._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar58._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar58._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar136 = packssdw(auVar87,auVar58);
  auVar62._0_12_ = auVar133._0_12_;
  auVar62._12_2_ = auVar133._6_2_;
  auVar62._14_2_ = auVar75._6_2_;
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._0_10_ = auVar133._0_10_;
  auVar61._10_2_ = auVar75._4_2_;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._0_8_ = auVar133._0_8_;
  auVar60._8_2_ = auVar133._4_2_;
  auVar59._8_8_ = auVar60._8_8_;
  auVar59._6_2_ = auVar75._2_2_;
  auVar59._4_2_ = auVar133._2_2_;
  auVar59._0_2_ = auVar133._0_2_;
  auVar59._2_2_ = auVar75._0_2_;
  auVar206._2_2_ = auVar75._8_2_;
  auVar206._0_2_ = auVar133._8_2_;
  auVar206._4_2_ = auVar133._10_2_;
  auVar206._6_2_ = auVar75._10_2_;
  auVar206._8_2_ = auVar133._12_2_;
  auVar206._10_2_ = auVar75._12_2_;
  auVar206._12_2_ = auVar133._14_2_;
  auVar206._14_2_ = auVar75._14_2_;
  auVar44 = pmaddwd(auVar59,auVar177);
  auVar160 = pmaddwd(auVar206,auVar177);
  auVar181._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar181._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar181._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar181._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar200._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar200._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar200._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar200._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  alVar182 = (__m128i)packssdw(auVar181,auVar200);
  auVar44 = pmaddwd(auVar59,auVar19);
  auVar160 = pmaddwd(auVar206,auVar19);
  auVar63._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar63._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar63._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar63._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar207._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar207._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar207._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar207._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  auVar160 = packssdw(auVar63,auVar207);
  auVar211._0_12_ = auVar92._0_12_;
  auVar211._12_2_ = auVar92._6_2_;
  auVar211._14_2_ = auVar118._6_2_;
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._0_10_ = auVar92._0_10_;
  auVar210._10_2_ = auVar118._4_2_;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._0_8_ = auVar92._0_8_;
  auVar209._8_2_ = auVar92._4_2_;
  auVar208._8_8_ = auVar209._8_8_;
  auVar208._6_2_ = auVar118._2_2_;
  auVar208._4_2_ = auVar92._2_2_;
  auVar208._0_2_ = auVar92._0_2_;
  auVar208._2_2_ = auVar118._0_2_;
  auVar120._2_2_ = auVar118._8_2_;
  auVar120._0_2_ = auVar92._8_2_;
  auVar120._4_2_ = auVar92._10_2_;
  auVar120._6_2_ = auVar118._10_2_;
  auVar120._8_2_ = auVar92._12_2_;
  auVar120._10_2_ = auVar118._12_2_;
  auVar120._12_2_ = auVar92._14_2_;
  auVar120._14_2_ = auVar118._14_2_;
  auVar75 = pmaddwd(auVar208,auVar177);
  auVar44 = pmaddwd(auVar177,auVar120);
  auVar92 = pmaddwd(auVar208,auVar19);
  auVar48 = pmaddwd(auVar120,auVar19);
  auVar171._0_4_ = auVar75._0_4_ + 0x800 >> 0xc;
  auVar171._4_4_ = auVar75._4_4_ + 0x800 >> 0xc;
  auVar171._8_4_ = auVar75._8_4_ + 0x800 >> 0xc;
  auVar171._12_4_ = auVar75._12_4_ + 0x800 >> 0xc;
  auVar185._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar185._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar185._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar185._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar44 = packssdw(auVar171,auVar185);
  auVar212._0_4_ = auVar92._0_4_ + 0x800 >> 0xc;
  auVar212._4_4_ = auVar92._4_4_ + 0x800 >> 0xc;
  auVar212._8_4_ = auVar92._8_4_ + 0x800 >> 0xc;
  auVar212._12_4_ = auVar92._12_4_ + 0x800 >> 0xc;
  auVar121._0_4_ = auVar48._0_4_ + 0x800 >> 0xc;
  auVar121._4_4_ = auVar48._4_4_ + 0x800 >> 0xc;
  auVar121._8_4_ = auVar48._8_4_ + 0x800 >> 0xc;
  auVar121._12_4_ = auVar48._12_4_ + 0x800 >> 0xc;
  alVar213 = (__m128i)packssdw(auVar212,auVar121);
  local_48 = auVar193._0_8_;
  lStack_40 = auVar193._8_8_;
  (*output)[0] = local_48;
  (*output)[1] = lStack_40;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar183);
  output[1] = alVar1;
  output[2] = alVar191;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar13);
  output[3] = alVar1;
  output[4] = alVar145;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar44);
  output[5] = alVar1;
  output[6] = alVar182;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar112);
  output[7] = alVar1;
  output[8] = alVar42;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar160);
  output[9] = alVar1;
  output[10] = alVar213;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar136);
  output[0xb] = alVar1;
  local_c8 = auVar96._0_8_;
  lStack_c0 = auVar96._8_8_;
  output[0xc][0] = local_c8;
  output[0xc][1] = lStack_c0;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar163);
  output[0xd] = alVar1;
  local_b8 = auVar91._0_8_;
  lStack_b0 = auVar91._8_8_;
  output[0xe][0] = local_b8;
  output[0xe][1] = lStack_b0;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar202);
  output[0xf] = alVar1;
  return;
}

Assistant:

static void iadst16_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  const __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  const __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  const __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  const __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  const __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  const __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  const __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  const __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  const __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  const __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  const __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  const __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  const __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  const __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  const __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m128i x[16];
  x[0] = input[15];
  x[1] = input[0];
  x[2] = input[13];
  x[3] = input[2];
  x[4] = input[11];
  x[5] = input[4];
  x[6] = input[9];
  x[7] = input[6];
  x[8] = input[7];
  x[9] = input[8];
  x[10] = input[5];
  x[11] = input[10];
  x[12] = input[3];
  x[13] = input[12];
  x[14] = input[1];
  x[15] = input[14];

  // stage 2
  btf_16_sse2(cospi_p02_p62, cospi_p62_m02, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p10_p54, cospi_p54_m10, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p18_p46, cospi_p46_m18, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_p26_p38, cospi_p38_m26, x[6], x[7], x[6], x[7]);
  btf_16_sse2(cospi_p34_p30, cospi_p30_m34, x[8], x[9], x[8], x[9]);
  btf_16_sse2(cospi_p42_p22, cospi_p22_m42, x[10], x[11], x[10], x[11]);
  btf_16_sse2(cospi_p50_p14, cospi_p14_m50, x[12], x[13], x[12], x[13]);
  btf_16_sse2(cospi_p58_p06, cospi_p06_m58, x[14], x[15], x[14], x[15]);

  // stage 3~9
  iadst16_stage3_ssse3(x);
  iadst16_stage4_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage5_ssse3(x);
  iadst16_stage6_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage7_ssse3(x);
  iadst16_stage8_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage9_ssse3(output, x);
}